

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_gpu_shader4(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_gpu_shader4 != 0) {
    glad_glGetUniformuivEXT = (PFNGLGETUNIFORMUIVEXTPROC)(*load)("glGetUniformuivEXT");
    glad_glBindFragDataLocationEXT =
         (PFNGLBINDFRAGDATALOCATIONEXTPROC)(*load)("glBindFragDataLocationEXT");
    glad_glGetFragDataLocationEXT =
         (PFNGLGETFRAGDATALOCATIONEXTPROC)(*load)("glGetFragDataLocationEXT");
    glad_glUniform1uiEXT = (PFNGLUNIFORM1UIEXTPROC)(*load)("glUniform1uiEXT");
    glad_glUniform2uiEXT = (PFNGLUNIFORM2UIEXTPROC)(*load)("glUniform2uiEXT");
    glad_glUniform3uiEXT = (PFNGLUNIFORM3UIEXTPROC)(*load)("glUniform3uiEXT");
    glad_glUniform4uiEXT = (PFNGLUNIFORM4UIEXTPROC)(*load)("glUniform4uiEXT");
    glad_glUniform1uivEXT = (PFNGLUNIFORM1UIVEXTPROC)(*load)("glUniform1uivEXT");
    glad_glUniform2uivEXT = (PFNGLUNIFORM2UIVEXTPROC)(*load)("glUniform2uivEXT");
    glad_glUniform3uivEXT = (PFNGLUNIFORM3UIVEXTPROC)(*load)("glUniform3uivEXT");
    glad_glUniform4uivEXT = (PFNGLUNIFORM4UIVEXTPROC)(*load)("glUniform4uivEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_gpu_shader4(GLADloadproc load) {
	if(!GLAD_GL_EXT_gpu_shader4) return;
	glad_glGetUniformuivEXT = (PFNGLGETUNIFORMUIVEXTPROC)load("glGetUniformuivEXT");
	glad_glBindFragDataLocationEXT = (PFNGLBINDFRAGDATALOCATIONEXTPROC)load("glBindFragDataLocationEXT");
	glad_glGetFragDataLocationEXT = (PFNGLGETFRAGDATALOCATIONEXTPROC)load("glGetFragDataLocationEXT");
	glad_glUniform1uiEXT = (PFNGLUNIFORM1UIEXTPROC)load("glUniform1uiEXT");
	glad_glUniform2uiEXT = (PFNGLUNIFORM2UIEXTPROC)load("glUniform2uiEXT");
	glad_glUniform3uiEXT = (PFNGLUNIFORM3UIEXTPROC)load("glUniform3uiEXT");
	glad_glUniform4uiEXT = (PFNGLUNIFORM4UIEXTPROC)load("glUniform4uiEXT");
	glad_glUniform1uivEXT = (PFNGLUNIFORM1UIVEXTPROC)load("glUniform1uivEXT");
	glad_glUniform2uivEXT = (PFNGLUNIFORM2UIVEXTPROC)load("glUniform2uivEXT");
	glad_glUniform3uivEXT = (PFNGLUNIFORM3UIVEXTPROC)load("glUniform3uivEXT");
	glad_glUniform4uivEXT = (PFNGLUNIFORM4UIVEXTPROC)load("glUniform4uivEXT");
}